

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_1f29eed::IntProColTest::IntProColTest(IntProColTest *this)

{
  int iVar1;
  int iVar2;
  ParamType *pPVar3;
  
  pPVar3 = testing::
           WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
           ::GetParam();
  iVar1 = *(int *)&(pPVar3->
                   super__Tuple_impl<0UL,_int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
                   ).
                   super__Tuple_impl<1UL,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
                   .field_0x14;
  pPVar3 = testing::
           WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
           ::GetParam();
  iVar2 = (pPVar3->
          super__Tuple_impl<0UL,_int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
          ).
          super__Tuple_impl<1UL,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
          .super__Head_base<1UL,_int,_false>._M_head_impl;
  testing::Test::Test((Test *)this);
  (this->super_AverageTestBase<unsigned_char>).width_ = iVar1;
  (this->super_AverageTestBase<unsigned_char>).height_ = iVar2;
  (this->super_AverageTestBase<unsigned_char>).source_data_ = (uchar *)0x0;
  (this->super_AverageTestBase<unsigned_char>).source_stride_ = 0;
  (this->super_AverageTestBase<unsigned_char>).bit_depth_ = 8;
  (this->super_AverageTestBase<unsigned_char>).rnd_.random_.state_ = 0xbaba;
  (this->super_AverageTestBase<unsigned_char>).super_Test._vptr_Test =
       (_func_int **)&PTR__IntProColTest_0109bad8;
  (this->
  super_WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
  )._vptr_WithParamInterface = (_func_int **)&PTR__IntProColTest_0109bb18;
  this->vbuf_asm_ = (int16_t *)0x0;
  this->vbuf_c_ = (int16_t *)0x0;
  pPVar3 = testing::
           WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
           ::GetParam();
  this->asm_func_ =
       (IntProColFunc)
       (pPVar3->
       super__Tuple_impl<0UL,_int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       ).
       super__Tuple_impl<1UL,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       .
       super__Tuple_impl<2UL,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       .super__Head_base<2UL,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_false>.
       _M_head_impl;
  pPVar3 = testing::
           WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
           ::GetParam();
  this->c_func_ =
       (IntProColFunc)
       (pPVar3->
       super__Tuple_impl<0UL,_int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       ).
       super__Tuple_impl<1UL,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       .
       super__Tuple_impl<2UL,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       .super__Tuple_impl<3UL,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>.
       super__Head_base<3UL,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_false>.
       _M_head_impl;
  return;
}

Assistant:

IntProColTest()
      : AverageTestBase(GET_PARAM(0), GET_PARAM(1)), vbuf_asm_(nullptr),
        vbuf_c_(nullptr) {
    asm_func_ = GET_PARAM(2);
    c_func_ = GET_PARAM(3);
  }